

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

bool __thiscall
bidirectional::BiDirectional::terminate(BiDirectional *this,Directions *direction,Label *label)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  pointer pPVar4;
  pointer in_RDX;
  BiDirectional *in_RSI;
  double *timediff_sec;
  BiDirectional *in_stack_ffffffffffffffd0;
  Vertex label_00;
  
  getElapsedTime(in_stack_ffffffffffffffd0);
  label_00 = (Vertex)&stack0xffffffffffffffd0;
  pPVar4 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
           operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                       *)0x246710);
  uVar3 = std::isnan(pPVar4->time_limit);
  if (((uVar3 & 1) == 0) &&
     (dVar1 = *(double *)label_00,
     pPVar4 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
              operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                          *)0x24673b), pPVar4->time_limit <= dVar1)) {
    return true;
  }
  bVar2 = checkValidLabel(in_RSI,(Directions *)in_RDX,(Label *)label_00);
  return bVar2;
}

Assistant:

bool BiDirectional::terminate(
    const Directions&       direction,
    const labelling::Label& label) {
  // Check time elapsed (if relevant)
  const double& timediff_sec = getElapsedTime();
  if (!std::isnan(params_ptr_->time_limit) &&
      timediff_sec >= params_ptr_->time_limit) {
    return true;
  }
  return checkValidLabel(direction, label);
}